

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# java_map_field_lite.cc
# Opt level: O0

void google::protobuf::compiler::java::anon_unknown_5::SetMessageVariables
               (FieldDescriptor *descriptor,int messageBitIndex,int builderBitIndex,
               FieldGeneratorInfo *info,Context *context,
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               *variables)

{
  ClassNameResolver *pCVar1;
  bool bVar2;
  FieldDescriptor *pFVar3;
  Descriptor *pDVar4;
  mapped_type *pmVar5;
  char *pcVar6;
  FileDescriptor *pFVar7;
  FieldOptions *pFVar8;
  mapped_type *this;
  ClassNameResolver *name_resolver_00;
  int bitIndex;
  int bitIndex_00;
  FieldDescriptor *field;
  FieldDescriptor *field_00;
  FieldDescriptor *field_01;
  Descriptor *descriptor_00;
  undefined1 boxed;
  undefined7 uVar9;
  bool local_b41;
  allocator local_a01;
  key_type local_a00;
  string local_9e0 [39];
  allocator local_9b9;
  key_type local_9b8;
  string local_998;
  string local_978;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_958;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_938;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_918;
  allocator local_8f1;
  key_type local_8f0;
  allocator local_8c9;
  key_type local_8c8;
  allocator local_8a1;
  key_type local_8a0;
  allocator local_879;
  key_type local_878;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_858;
  allocator local_831;
  key_type local_830;
  string local_810;
  allocator local_7e9;
  key_type local_7e8;
  string local_7c8;
  allocator local_7a1;
  key_type local_7a0;
  allocator local_779;
  key_type local_778;
  byte local_756;
  allocator local_755;
  byte local_754;
  byte local_753;
  byte local_752;
  allocator local_751;
  key_type local_750;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_730;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_710;
  allocator local_6e9;
  key_type local_6e8;
  allocator local_6c1;
  key_type local_6c0;
  allocator local_699;
  key_type local_698;
  allocator local_671;
  key_type local_670;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_650;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_630;
  allocator local_609;
  key_type local_608;
  string local_5e8;
  allocator local_5c1;
  key_type local_5c0;
  string local_5a0;
  allocator local_579;
  key_type local_578;
  string local_558;
  allocator local_531;
  key_type local_530;
  string local_510;
  allocator local_4e9;
  key_type local_4e8;
  string local_4c8;
  allocator local_4a1;
  key_type local_4a0;
  allocator local_479;
  key_type local_478;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_458;
  allocator local_431;
  key_type local_430;
  string local_410;
  allocator local_3e9;
  key_type local_3e8;
  string local_3c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3a8;
  allocator local_381;
  key_type local_380;
  string local_360;
  allocator local_339;
  key_type local_338;
  allocator local_311;
  key_type local_310;
  allocator local_2e9;
  key_type local_2e8;
  allocator local_2c1;
  key_type local_2c0;
  allocator local_299;
  key_type local_298;
  string local_278;
  allocator local_251;
  key_type local_250;
  string local_230;
  allocator local_209;
  key_type local_208;
  string local_1e8 [39];
  allocator local_1c1;
  key_type local_1c0;
  string local_1a0;
  allocator local_179;
  key_type local_178;
  string local_158;
  allocator local_131;
  key_type local_130;
  undefined1 local_110 [8];
  string boxed_key_type;
  key_type local_e8;
  string local_c8;
  JavaType local_a8;
  JavaType local_a4;
  JavaType valueJavaType;
  JavaType keyJavaType;
  FieldDescriptor *value;
  FieldDescriptor *key;
  allocator local_79;
  key_type local_78;
  string local_58;
  FieldDescriptor *local_38;
  ClassNameResolver *name_resolver;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *variables_local;
  Context *context_local;
  FieldGeneratorInfo *info_local;
  int builderBitIndex_local;
  int messageBitIndex_local;
  FieldDescriptor *descriptor_local;
  
  boxed = SUB81(context,0);
  uVar9 = (undefined7)((ulong)context >> 8);
  name_resolver = (ClassNameResolver *)variables;
  variables_local =
       (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        *)context;
  context_local = (Context *)info;
  info_local._0_4_ = builderBitIndex;
  info_local._4_4_ = messageBitIndex;
  _builderBitIndex_local = descriptor;
  SetCommonFieldVariables(descriptor,info,variables);
  pFVar3 = (FieldDescriptor *)Context::GetNameResolver((Context *)variables_local);
  local_38 = pFVar3;
  pDVar4 = FieldDescriptor::message_type(_builderBitIndex_local);
  ClassNameResolver::GetImmutableClassName<google::protobuf::Descriptor>
            (&local_58,(ClassNameResolver *)pFVar3,pDVar4);
  pCVar1 = name_resolver;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_78,"type",&local_79);
  pmVar5 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                         *)pCVar1,&local_78);
  std::__cxx11::string::operator=((string *)pmVar5,(string *)&local_58);
  std::__cxx11::string::~string((string *)&local_78);
  std::allocator<char>::~allocator((allocator<char> *)&local_79);
  std::__cxx11::string::~string((string *)&local_58);
  value = KeyField(_builderBitIndex_local);
  _valueJavaType = ValueField(_builderBitIndex_local);
  local_a4 = GetJavaType(value);
  local_a8 = GetJavaType(_valueJavaType);
  (anonymous_namespace)::TypeName_abi_cxx11_
            (&local_c8,(_anonymous_namespace_ *)value,local_38,(ClassNameResolver *)0x0,(bool)boxed)
  ;
  pCVar1 = name_resolver;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_e8,"key_type",(allocator *)(boxed_key_type.field_2._M_local_buf + 0xf)
            );
  pmVar5 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                         *)pCVar1,&local_e8);
  std::__cxx11::string::operator=((string *)pmVar5,(string *)&local_c8);
  std::__cxx11::string::~string((string *)&local_e8);
  std::allocator<char>::~allocator((allocator<char> *)(boxed_key_type.field_2._M_local_buf + 0xf));
  std::__cxx11::string::~string((string *)&local_c8);
  name_resolver_00 = (ClassNameResolver *)0x1;
  (anonymous_namespace)::TypeName_abi_cxx11_
            ((string *)local_110,(_anonymous_namespace_ *)value,local_38,(ClassNameResolver *)0x1,
             (bool)boxed);
  pCVar1 = name_resolver;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_130,"boxed_key_type",&local_131);
  pmVar5 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                         *)pCVar1,&local_130);
  std::__cxx11::string::operator=((string *)pmVar5,(string *)local_110);
  std::__cxx11::string::~string((string *)&local_130);
  std::allocator<char>::~allocator((allocator<char> *)&local_131);
  (anonymous_namespace)::KotlinTypeName_abi_cxx11_
            (&local_158,(_anonymous_namespace_ *)value,local_38,name_resolver_00);
  pCVar1 = name_resolver;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_178,"kt_key_type",&local_179);
  pmVar5 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                         *)pCVar1,&local_178);
  std::__cxx11::string::operator=((string *)pmVar5,(string *)&local_158);
  std::__cxx11::string::~string((string *)&local_178);
  std::allocator<char>::~allocator((allocator<char> *)&local_179);
  std::__cxx11::string::~string((string *)&local_158);
  (anonymous_namespace)::KotlinTypeName_abi_cxx11_
            (&local_1a0,(_anonymous_namespace_ *)_valueJavaType,local_38,name_resolver_00);
  pCVar1 = name_resolver;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_1c0,"kt_value_type",&local_1c1);
  pmVar5 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                         *)pCVar1,&local_1c0);
  std::__cxx11::string::operator=((string *)pmVar5,(string *)&local_1a0);
  std::__cxx11::string::~string((string *)&local_1c0);
  std::allocator<char>::~allocator((allocator<char> *)&local_1c1);
  std::__cxx11::string::~string((string *)&local_1a0);
  std::__cxx11::string::rfind((char)local_110,0x2e);
  std::__cxx11::string::substr((ulong)local_1e8,(ulong)local_110);
  pCVar1 = name_resolver;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_208,"short_key_type",&local_209);
  pmVar5 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                         *)pCVar1,&local_208);
  std::__cxx11::string::operator=((string *)pmVar5,local_1e8);
  std::__cxx11::string::~string((string *)&local_208);
  std::allocator<char>::~allocator((allocator<char> *)&local_209);
  std::__cxx11::string::~string(local_1e8);
  (anonymous_namespace)::WireType_abi_cxx11_(&local_230,(_anonymous_namespace_ *)value,field);
  pCVar1 = name_resolver;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_250,"key_wire_type",&local_251);
  pmVar5 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                         *)pCVar1,&local_250);
  std::__cxx11::string::operator=((string *)pmVar5,(string *)&local_230);
  std::__cxx11::string::~string((string *)&local_250);
  std::allocator<char>::~allocator((allocator<char> *)&local_251);
  std::__cxx11::string::~string((string *)&local_230);
  DefaultValue_abi_cxx11_
            (&local_278,(java *)value,(FieldDescriptor *)0x1,SUB81(local_38,0),
             (ClassNameResolver *)CONCAT71(uVar9,boxed));
  pCVar1 = name_resolver;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_298,"key_default_value",&local_299);
  pmVar5 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                         *)pCVar1,&local_298);
  std::__cxx11::string::operator=((string *)pmVar5,(string *)&local_278);
  std::__cxx11::string::~string((string *)&local_298);
  std::allocator<char>::~allocator((allocator<char> *)&local_299);
  std::__cxx11::string::~string((string *)&local_278);
  bVar2 = IsReferenceType(local_a4);
  pCVar1 = name_resolver;
  pcVar6 = "";
  if (bVar2) {
    pcVar6 = "if (key == null) { throw new NullPointerException(\"map key\"); }";
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_2c0,"key_null_check",&local_2c1);
  pmVar5 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                         *)pCVar1,&local_2c0);
  std::__cxx11::string::operator=((string *)pmVar5,pcVar6);
  std::__cxx11::string::~string((string *)&local_2c0);
  std::allocator<char>::~allocator((allocator<char> *)&local_2c1);
  local_b41 = false;
  if (local_a8 != JAVATYPE_ENUM) {
    local_b41 = IsReferenceType(local_a8);
  }
  pCVar1 = name_resolver;
  pcVar6 = "";
  if (local_b41 != false) {
    pcVar6 = "if (value == null) {\n  throw new NullPointerException(\"map value\");\n}\n";
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_2e8,"value_null_check",&local_2e9);
  pmVar5 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                         *)pCVar1,&local_2e8);
  std::__cxx11::string::operator=((string *)pmVar5,pcVar6);
  std::__cxx11::string::~string((string *)&local_2e8);
  std::allocator<char>::~allocator((allocator<char> *)&local_2e9);
  pCVar1 = name_resolver;
  if (local_a8 == JAVATYPE_ENUM) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_310,"value_type",&local_311);
    pmVar5 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                           *)pCVar1,&local_310);
    std::__cxx11::string::operator=((string *)pmVar5,"int");
    std::__cxx11::string::~string((string *)&local_310);
    std::allocator<char>::~allocator((allocator<char> *)&local_311);
    pCVar1 = name_resolver;
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_338,"boxed_value_type",&local_339);
    pmVar5 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                           *)pCVar1,&local_338);
    std::__cxx11::string::operator=((string *)pmVar5,"java.lang.Integer");
    std::__cxx11::string::~string((string *)&local_338);
    std::allocator<char>::~allocator((allocator<char> *)&local_339);
    (anonymous_namespace)::WireType_abi_cxx11_
              (&local_360,(_anonymous_namespace_ *)_valueJavaType,field_00);
    pCVar1 = name_resolver;
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_380,"value_wire_type",&local_381);
    pmVar5 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                           *)pCVar1,&local_380);
    std::__cxx11::string::operator=((string *)pmVar5,(string *)&local_360);
    std::__cxx11::string::~string((string *)&local_380);
    std::allocator<char>::~allocator((allocator<char> *)&local_381);
    std::__cxx11::string::~string((string *)&local_360);
    DefaultValue_abi_cxx11_
              (&local_3c8,(java *)_valueJavaType,(FieldDescriptor *)0x1,SUB81(local_38,0),
               (ClassNameResolver *)CONCAT71(uVar9,boxed));
    std::operator+(&local_3a8,&local_3c8,".getNumber()");
    pCVar1 = name_resolver;
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_3e8,"value_default_value",&local_3e9);
    pmVar5 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                           *)pCVar1,&local_3e8);
    std::__cxx11::string::operator=((string *)pmVar5,(string *)&local_3a8);
    std::__cxx11::string::~string((string *)&local_3e8);
    std::allocator<char>::~allocator((allocator<char> *)&local_3e9);
    std::__cxx11::string::~string((string *)&local_3a8);
    std::__cxx11::string::~string((string *)&local_3c8);
    (anonymous_namespace)::TypeName_abi_cxx11_
              (&local_410,(_anonymous_namespace_ *)_valueJavaType,local_38,(ClassNameResolver *)0x0,
               (bool)boxed);
    pCVar1 = name_resolver;
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_430,"value_enum_type",&local_431);
    pmVar5 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                           *)pCVar1,&local_430);
    std::__cxx11::string::operator=((string *)pmVar5,(string *)&local_410);
    std::__cxx11::string::~string((string *)&local_430);
    std::allocator<char>::~allocator((allocator<char> *)&local_431);
    std::__cxx11::string::~string((string *)&local_410);
    pFVar7 = FieldDescriptor::file(_builderBitIndex_local);
    bVar2 = SupportUnknownEnumValue(pFVar7);
    pCVar1 = name_resolver;
    if (bVar2) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_478,"value_enum_type",&local_479);
      pmVar5 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                             *)pCVar1,&local_478);
      std::operator+(&local_458,pmVar5,".UNRECOGNIZED");
      pCVar1 = name_resolver;
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_4a0,"unrecognized_value",&local_4a1);
      pmVar5 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                             *)pCVar1,&local_4a0);
      std::__cxx11::string::operator=((string *)pmVar5,(string *)&local_458);
      std::__cxx11::string::~string((string *)&local_4a0);
      std::allocator<char>::~allocator((allocator<char> *)&local_4a1);
      std::__cxx11::string::~string((string *)&local_458);
      std::__cxx11::string::~string((string *)&local_478);
      std::allocator<char>::~allocator((allocator<char> *)&local_479);
    }
    else {
      DefaultValue_abi_cxx11_
                (&local_4c8,(java *)_valueJavaType,(FieldDescriptor *)0x1,SUB81(local_38,0),
                 (ClassNameResolver *)CONCAT71(uVar9,boxed));
      pCVar1 = name_resolver;
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_4e8,"unrecognized_value",&local_4e9);
      pmVar5 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                             *)pCVar1,&local_4e8);
      std::__cxx11::string::operator=((string *)pmVar5,(string *)&local_4c8);
      std::__cxx11::string::~string((string *)&local_4e8);
      std::allocator<char>::~allocator((allocator<char> *)&local_4e9);
      std::__cxx11::string::~string((string *)&local_4c8);
    }
  }
  else {
    (anonymous_namespace)::TypeName_abi_cxx11_
              (&local_510,(_anonymous_namespace_ *)_valueJavaType,local_38,(ClassNameResolver *)0x0,
               (bool)boxed);
    pCVar1 = name_resolver;
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_530,"value_type",&local_531);
    pmVar5 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                           *)pCVar1,&local_530);
    std::__cxx11::string::operator=((string *)pmVar5,(string *)&local_510);
    std::__cxx11::string::~string((string *)&local_530);
    std::allocator<char>::~allocator((allocator<char> *)&local_531);
    std::__cxx11::string::~string((string *)&local_510);
    (anonymous_namespace)::TypeName_abi_cxx11_
              (&local_558,(_anonymous_namespace_ *)_valueJavaType,local_38,(ClassNameResolver *)0x1,
               (bool)boxed);
    pCVar1 = name_resolver;
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_578,"boxed_value_type",&local_579);
    pmVar5 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                           *)pCVar1,&local_578);
    std::__cxx11::string::operator=((string *)pmVar5,(string *)&local_558);
    std::__cxx11::string::~string((string *)&local_578);
    std::allocator<char>::~allocator((allocator<char> *)&local_579);
    std::__cxx11::string::~string((string *)&local_558);
    (anonymous_namespace)::WireType_abi_cxx11_
              (&local_5a0,(_anonymous_namespace_ *)_valueJavaType,field_01);
    pCVar1 = name_resolver;
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_5c0,"value_wire_type",&local_5c1);
    pmVar5 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                           *)pCVar1,&local_5c0);
    std::__cxx11::string::operator=((string *)pmVar5,(string *)&local_5a0);
    std::__cxx11::string::~string((string *)&local_5c0);
    std::allocator<char>::~allocator((allocator<char> *)&local_5c1);
    std::__cxx11::string::~string((string *)&local_5a0);
    DefaultValue_abi_cxx11_
              (&local_5e8,(java *)_valueJavaType,(FieldDescriptor *)0x1,SUB81(local_38,0),
               (ClassNameResolver *)CONCAT71(uVar9,boxed));
    pCVar1 = name_resolver;
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_608,"value_default_value",&local_609);
    pmVar5 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                           *)pCVar1,&local_608);
    std::__cxx11::string::operator=((string *)pmVar5,(string *)&local_5e8);
    std::__cxx11::string::~string((string *)&local_608);
    std::allocator<char>::~allocator((allocator<char> *)&local_609);
    std::__cxx11::string::~string((string *)&local_5e8);
  }
  pCVar1 = name_resolver;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_670,"boxed_key_type",&local_671);
  pmVar5 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                         *)pCVar1,&local_670);
  std::operator+(&local_650,pmVar5,", ");
  pCVar1 = name_resolver;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_698,"boxed_value_type",&local_699);
  pmVar5 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                         *)pCVar1,&local_698);
  std::operator+(&local_630,&local_650,pmVar5);
  pCVar1 = name_resolver;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_6c0,"type_parameters",&local_6c1);
  pmVar5 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                         *)pCVar1,&local_6c0);
  std::__cxx11::string::operator=((string *)pmVar5,(string *)&local_630);
  std::__cxx11::string::~string((string *)&local_6c0);
  std::allocator<char>::~allocator((allocator<char> *)&local_6c1);
  std::__cxx11::string::~string((string *)&local_630);
  std::__cxx11::string::~string((string *)&local_698);
  std::allocator<char>::~allocator((allocator<char> *)&local_699);
  std::__cxx11::string::~string((string *)&local_650);
  std::__cxx11::string::~string((string *)&local_670);
  std::allocator<char>::~allocator((allocator<char> *)&local_671);
  pFVar8 = FieldDescriptor::options(_builderBitIndex_local);
  bVar2 = FieldOptions::deprecated(pFVar8);
  pCVar1 = name_resolver;
  pcVar6 = "";
  if (bVar2) {
    pcVar6 = "@java.lang.Deprecated ";
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_6e8,"deprecation",&local_6e9);
  pmVar5 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                         *)pCVar1,&local_6e8);
  std::__cxx11::string::operator=((string *)pmVar5,pcVar6);
  std::__cxx11::string::~string((string *)&local_6e8);
  std::allocator<char>::~allocator((allocator<char> *)&local_6e9);
  local_752 = 0;
  local_753 = 0;
  local_754 = 0;
  local_756 = 0;
  pFVar8 = FieldDescriptor::options(_builderBitIndex_local);
  bVar2 = FieldOptions::deprecated(pFVar8);
  pCVar1 = name_resolver;
  if (bVar2) {
    std::allocator<char>::allocator();
    local_752 = 1;
    std::__cxx11::string::string((string *)&local_750,"name",&local_751);
    local_753 = 1;
    pmVar5 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                           *)pCVar1,&local_750);
    std::operator+(&local_730,"@kotlin.Deprecated(message = \"Field ",pmVar5);
    local_754 = 1;
    std::operator+(&local_710,&local_730," is deprecated\") ");
  }
  else {
    std::allocator<char>::allocator();
    local_756 = 1;
    std::__cxx11::string::string((string *)&local_710,"",&local_755);
  }
  pCVar1 = name_resolver;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_778,"kt_deprecation",&local_779);
  pmVar5 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                         *)pCVar1,&local_778);
  std::__cxx11::string::operator=((string *)pmVar5,(string *)&local_710);
  std::__cxx11::string::~string((string *)&local_778);
  std::allocator<char>::~allocator((allocator<char> *)&local_779);
  std::__cxx11::string::~string((string *)&local_710);
  if ((local_756 & 1) != 0) {
    std::allocator<char>::~allocator((allocator<char> *)&local_755);
  }
  if ((local_754 & 1) != 0) {
    std::__cxx11::string::~string((string *)&local_730);
  }
  if ((local_753 & 1) != 0) {
    std::__cxx11::string::~string((string *)&local_750);
  }
  if ((local_752 & 1) != 0) {
    std::allocator<char>::~allocator((allocator<char> *)&local_751);
  }
  pCVar1 = name_resolver;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_7a0,"on_changed",&local_7a1);
  pmVar5 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                         *)pCVar1,&local_7a0);
  std::__cxx11::string::operator=((string *)pmVar5,"onChanged();");
  std::__cxx11::string::~string((string *)&local_7a0);
  std::allocator<char>::~allocator((allocator<char> *)&local_7a1);
  GenerateGetBitMutableLocal_abi_cxx11_(&local_7c8,(java *)(ulong)(uint)info_local,bitIndex);
  pCVar1 = name_resolver;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_7e8,"get_mutable_bit_parser",&local_7e9);
  pmVar5 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                         *)pCVar1,&local_7e8);
  std::__cxx11::string::operator=((string *)pmVar5,(string *)&local_7c8);
  std::__cxx11::string::~string((string *)&local_7e8);
  std::allocator<char>::~allocator((allocator<char> *)&local_7e9);
  std::__cxx11::string::~string((string *)&local_7c8);
  GenerateSetBitMutableLocal_abi_cxx11_(&local_810,(java *)(ulong)(uint)info_local,bitIndex_00);
  pCVar1 = name_resolver;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_830,"set_mutable_bit_parser",&local_831);
  pmVar5 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                         *)pCVar1,&local_830);
  std::__cxx11::string::operator=((string *)pmVar5,(string *)&local_810);
  std::__cxx11::string::~string((string *)&local_830);
  std::allocator<char>::~allocator((allocator<char> *)&local_831);
  std::__cxx11::string::~string((string *)&local_810);
  pCVar1 = name_resolver;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_878,"capitalized_name",&local_879);
  pmVar5 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                         *)pCVar1,&local_878);
  std::operator+(&local_858,pmVar5,"DefaultEntryHolder.defaultEntry");
  pCVar1 = name_resolver;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_8a0,"default_entry",&local_8a1);
  pmVar5 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                         *)pCVar1,&local_8a0);
  std::__cxx11::string::operator=((string *)pmVar5,(string *)&local_858);
  std::__cxx11::string::~string((string *)&local_8a0);
  std::allocator<char>::~allocator((allocator<char> *)&local_8a1);
  std::__cxx11::string::~string((string *)&local_858);
  std::__cxx11::string::~string((string *)&local_878);
  std::allocator<char>::~allocator((allocator<char> *)&local_879);
  pCVar1 = name_resolver;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_8c8,"default_entry",&local_8c9);
  pmVar5 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                         *)pCVar1,&local_8c8);
  pCVar1 = name_resolver;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_8f0,"map_field_parameter",&local_8f1);
  this = std::
         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
         ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                       *)pCVar1,&local_8f0);
  std::__cxx11::string::operator=((string *)this,(string *)pmVar5);
  std::__cxx11::string::~string((string *)&local_8f0);
  std::allocator<char>::~allocator((allocator<char> *)&local_8f1);
  std::__cxx11::string::~string((string *)&local_8c8);
  std::allocator<char>::~allocator((allocator<char> *)&local_8c9);
  pFVar3 = local_38;
  pFVar7 = FieldDescriptor::file(_builderBitIndex_local);
  ClassNameResolver::GetImmutableClassName<google::protobuf::FileDescriptor>
            (&local_978,(ClassNameResolver *)pFVar3,pFVar7);
  std::operator+(&local_958,&local_978,".internal_");
  pDVar4 = FieldDescriptor::message_type(_builderBitIndex_local);
  UniqueFileScopeIdentifier_abi_cxx11_(&local_998,(java *)pDVar4,descriptor_00);
  std::operator+(&local_938,&local_958,&local_998);
  std::operator+(&local_918,&local_938,"_descriptor, ");
  pCVar1 = name_resolver;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_9b8,"descriptor",&local_9b9);
  pmVar5 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                         *)pCVar1,&local_9b8);
  std::__cxx11::string::operator=((string *)pmVar5,(string *)&local_918);
  std::__cxx11::string::~string((string *)&local_9b8);
  std::allocator<char>::~allocator((allocator<char> *)&local_9b9);
  std::__cxx11::string::~string((string *)&local_918);
  std::__cxx11::string::~string((string *)&local_938);
  std::__cxx11::string::~string((string *)&local_998);
  std::__cxx11::string::~string((string *)&local_958);
  std::__cxx11::string::~string((string *)&local_978);
  GeneratedCodeVersionSuffix_abi_cxx11_();
  pCVar1 = name_resolver;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_a00,"ver",&local_a01);
  pmVar5 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                         *)pCVar1,&local_a00);
  std::__cxx11::string::operator=((string *)pmVar5,local_9e0);
  std::__cxx11::string::~string((string *)&local_a00);
  std::allocator<char>::~allocator((allocator<char> *)&local_a01);
  std::__cxx11::string::~string(local_9e0);
  std::__cxx11::string::~string((string *)local_110);
  return;
}

Assistant:

void SetMessageVariables(const FieldDescriptor* descriptor, int messageBitIndex,
                         int builderBitIndex, const FieldGeneratorInfo* info,
                         Context* context,
                         std::map<std::string, std::string>* variables) {
  SetCommonFieldVariables(descriptor, info, variables);

  ClassNameResolver* name_resolver = context->GetNameResolver();
  (*variables)["type"] =
      name_resolver->GetImmutableClassName(descriptor->message_type());
  const FieldDescriptor* key = KeyField(descriptor);
  const FieldDescriptor* value = ValueField(descriptor);
  const JavaType keyJavaType = GetJavaType(key);
  const JavaType valueJavaType = GetJavaType(value);

  (*variables)["key_type"] = TypeName(key, name_resolver, false);
  (*variables)["boxed_key_type"] = TypeName(key, name_resolver, true);
  (*variables)["kt_key_type"] = KotlinTypeName(key, name_resolver);
  (*variables)["kt_value_type"] = KotlinTypeName(value, name_resolver);
  (*variables)["key_wire_type"] = WireType(key);
  (*variables)["key_default_value"] = DefaultValue(key, true, name_resolver);
  // We use `x.getClass()` as a null check because it generates less bytecode
  // than an `if (x == null) { throw ... }` statement.
  (*variables)["key_null_check"] =
      IsReferenceType(keyJavaType)
          ? "java.lang.Class<?> keyClass = key.getClass();"
          : "";
  (*variables)["value_null_check"] =
      IsReferenceType(valueJavaType)
          ? "java.lang.Class<?> valueClass = value.getClass();"
          : "";

  if (GetJavaType(value) == JAVATYPE_ENUM) {
    // We store enums as Integers internally.
    (*variables)["value_type"] = "int";
    (*variables)["boxed_value_type"] = "java.lang.Integer";
    (*variables)["value_wire_type"] = WireType(value);
    (*variables)["value_default_value"] =
        DefaultValue(value, true, name_resolver) + ".getNumber()";

    (*variables)["value_enum_type"] = TypeName(value, name_resolver, false);

    if (SupportUnknownEnumValue(descriptor->file())) {
      // Map unknown values to a special UNRECOGNIZED value if supported.
      (*variables)["unrecognized_value"] =
          (*variables)["value_enum_type"] + ".UNRECOGNIZED";
    } else {
      // Map unknown values to the default value if we don't have UNRECOGNIZED.
      (*variables)["unrecognized_value"] =
          DefaultValue(value, true, name_resolver);
    }
  } else {
    (*variables)["value_type"] = TypeName(value, name_resolver, false);
    (*variables)["boxed_value_type"] = TypeName(value, name_resolver, true);
    (*variables)["value_wire_type"] = WireType(value);
    (*variables)["value_default_value"] =
        DefaultValue(value, true, name_resolver);
  }
  (*variables)["type_parameters"] =
      (*variables)["boxed_key_type"] + ", " + (*variables)["boxed_value_type"];
  // TODO(birdo): Add @deprecated javadoc when generating javadoc is supported
  // by the proto compiler
  (*variables)["deprecation"] =
      descriptor->options().deprecated() ? "@java.lang.Deprecated " : "";
  (*variables)["kt_deprecation"] =
      descriptor->options().deprecated()
          ? "@kotlin.Deprecated(message = \"Field " + (*variables)["name"] +
                " is deprecated\") "
          : "";

  (*variables)["default_entry"] =
      (*variables)["capitalized_name"] + "DefaultEntryHolder.defaultEntry";
}